

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall ddd::DictionaryMLT<false,_false>::pack(DictionaryMLT<false,_false> *this)

{
  bool bVar1;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  vector<std::thread,_std::allocator<std::thread>_> *pvVar2;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> *in_RDI;
  thread *th;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  uint32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  type func;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  thread *in_stack_ffffffffffffffd0;
  vector<std::thread,_std::allocator<std::thread>_> local_28;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x17aea7);
  std::
  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  ::size((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
          *)(in_RDI + 2));
  std::vector<std::thread,_std::allocator<std::thread>_>::resize
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8);
  uVar3 = 0;
  while( true ) {
    this_00 = (vector<std::thread,_std::allocator<std::thread>_> *)(ulong)uVar3;
    pvVar2 = (vector<std::thread,_std::allocator<std::thread>_> *)
             std::
             vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ::size((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                     *)(in_RDI + 2));
    if (pvVar2 <= this_00) break;
    std::thread::
    thread<ddd::DictionaryMLT<false,false>::pack()::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              (in_stack_ffffffffffffffd0,(type *)CONCAT44(in_stack_ffffffffffffffcc,uVar3),
               in_stack_ffffffffffffffc0);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_28,(ulong)uVar3);
    std::thread::operator=((thread *)in_RDI,(thread *)this_00);
    std::thread::~thread((thread *)0x17af2b);
    uVar3 = uVar3 + 1;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::begin(this_00);
  std::vector<std::thread,_std::allocator<std::thread>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)this_00);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (vector<std::thread,_std::allocator<std::thread>_> *)
         __gnu_cxx::
         __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
         operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                    *)&stack0xffffffffffffffb0);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)&stack0xffffffffffffffb0);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void pack() {
    auto func = [&](uint32_t id) {
      if (suffix_subtries_[id]) {
        suffix_subtries_[id]->pack_bc();
        suffix_subtries_[id]->pack_tail();
      }
    };

    std::vector<std::thread> threads;
    threads.resize(suffix_subtries_.size());
    for (uint32_t i = 0; i < suffix_subtries_.size(); ++i) {
      threads[i] = std::thread(func, i);
    }
    for (auto& th : threads) {
      th.join();
    }
  }